

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteGeneric<unsigned_char,unsigned_char,unsigned_char,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseOROperator,bool>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  uchar *result_data;
  UnifiedVectorFormat rdata;
  uchar *local_b8;
  ValidityMask local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  UnifiedVectorFormat ldata;
  uchar *local_70;
  ValidityMask local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&rdata);
  duckdb::Vector::ToUnifiedFormat((ulong)left,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)right,(UnifiedVectorFormat *)count);
  duckdb::Vector::SetVectorType((VectorType)result);
  result_data = *(uchar **)(result + 0x20);
  FlatVector::VerifyFlatVector(result);
  ExecuteGenericLoop<unsigned_char,unsigned_char,unsigned_char,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseOROperator,bool>
            (local_70,local_b8,result_data,_ldata,_rdata,count,&local_68,&local_b0,
             (ValidityMask *)(result + 0x28),fun);
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_b0.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_68.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ExecuteGeneric(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		ExecuteGenericLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata),
		    result_data, ldata.sel, rdata.sel, count, ldata.validity, rdata.validity, FlatVector::Validity(result),
		    fun);
	}